

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O1

void init_keyboard(int flg)

{
  IOPAGE *pIVar1;
  
  pIVar1 = IOPage;
  EmMouseX68K = &IOPage->dlmousex;
  EmMouseY68K = &IOPage->dlmousey;
  EmCursorX68K = &IOPage->dlcursorx;
  EmCursorY68K = &IOPage->dlcursory;
  EmRealUtilin68K = &IOPage->dlutilin;
  EmUtilin68K = &InterfacePage->fakemousebits;
  EmKbdAd068K = &IOPage->dlkbdad0;
  EmKbdAd168K = &IOPage->dlkbdad1;
  EmKbdAd268K = &IOPage->dlkbdad2;
  EmKbdAd368K = &IOPage->dlkbdad3;
  EmKbdAd468K = &IOPage->dlkbdad4;
  EmKbdAd568K = &IOPage->dlkbdad5;
  EmDispInterrupt68K = &IOPage->dldispinterrupt;
  EmCursorBitMap68K = IOPage->dlcursorbitmap;
  IOPage->dlutilin = 0xffff;
  pIVar1->dlkbdad1 = 0xffff;
  pIVar1->dlkbdad0 = 0xffff;
  pIVar1->dlkbdad3 = 0xffff;
  pIVar1->dlkbdad2 = 0xffff;
  pIVar1->dlkbdad5 = 0xffff;
  pIVar1->dlkbdad4 = 0xffff;
  if (flg == 0) {
    keyboardtype(0);
  }
  init_Xevent(currentdsp);
  return;
}

Assistant:

void init_keyboard(int flg) /* if 0 init else re-init */
{
  set_kbd_iopointers();
  /* if using a raw keyboard, LispKbdFd would be the result of opening /dev/kbd
   * and it would be added to LispReadFds to generate keyboard events
   */
  if (flg == 0) { keyboardtype(LispKbdFd); }

#if   XWINDOW
  init_Xevent(currentdsp);
#elif DOS
  if (flg == 0) { /* Install the handlers ONLY when we */
    /* init the kbd the init the kbd the */
    /* first time. */

    /* turn on kbd */
    make_kbd_instance(currentkbd);
    (currentkbd->device.enter)(currentkbd);

    /* turn on mouse */
    make_mouse_instance(currentmouse);
    (currentmouse->device.enter)(currentmouse, currentdsp);
  }
#endif /* XWINDOW DOS */
}